

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::getp_htmlify(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  byte bVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  wchar_t wVar9;
  vm_obj_id_t vVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  char *p;
  bool bVar17;
  byte local_48;
  
  if (in_argc == (uint *)0x0) {
    bVar17 = true;
  }
  else {
    bVar17 = *in_argc == 0;
  }
  if (getp_htmlify(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_htmlify();
  }
  iVar7 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_htmlify::desc);
  if (iVar7 == 0) {
    if (bVar17) {
      uVar8 = 0;
    }
    else {
      uVar8 = CVmBif::pop_long_val();
    }
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    pbVar14 = (byte *)(ulong)*(ushort *)str;
    bVar17 = false;
    local_48 = (byte)uVar8;
    if (pbVar14 == (byte *)0x0) {
      lVar13 = 0;
    }
    else {
      lVar13 = 0;
      pbVar15 = (byte *)(str + 2);
      pbVar16 = pbVar14;
      do {
        wVar9 = utf8_ptr::s_getch((char *)pbVar15);
        bVar5 = false;
        if (wVar9 < L'&') {
          if (wVar9 == L'\t') {
            lVar13 = lVar13 + (ulong)(uVar8 & 4);
          }
          else {
            if (wVar9 == L'\n') {
LAB_002885aa:
              lVar11 = lVar13 + 3;
              bVar1 = local_48 & 2;
            }
            else {
              bVar5 = false;
              if (wVar9 != L' ') goto LAB_002885c9;
              lVar11 = lVar13 + 5;
              if (!bVar17) {
                lVar11 = lVar13;
              }
              bVar1 = local_48 & 1;
            }
            if (bVar1 != 0) {
              lVar13 = lVar11;
            }
          }
          bVar5 = true;
        }
        else if (wVar9 < L'>') {
          if (wVar9 == L'&') {
            lVar13 = lVar13 + 4;
          }
          else if (wVar9 == L'<') goto LAB_002885b9;
        }
        else if (wVar9 == L'>') {
LAB_002885b9:
          lVar13 = lVar13 + 3;
        }
        else {
          bVar5 = false;
          if (wVar9 == L'\x2028') goto LAB_002885aa;
        }
LAB_002885c9:
        bVar17 = bVar5;
        pbVar16 = pbVar15 + ((long)pbVar16 -
                            (long)(pbVar15 +
                                  (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3
                                         ) + 1));
        pbVar15 = pbVar15 + (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3) + 1;
      } while (pbVar16 != (byte *)0x0);
    }
    bVar17 = false;
    vVar10 = create(0,(size_t)(pbVar14 + lVar13));
    if (pbVar14 != (byte *)0x0) {
      p = (char *)(*(long *)((long)&G_obj_table_X.pages_[vVar10 >> 0xc][vVar10 & 0xfff].ptr_ + 8) +
                  2);
      pbVar15 = (byte *)(str + 2);
      do {
        wVar9 = utf8_ptr::s_getch((char *)pbVar15);
        bVar5 = false;
        if (wVar9 < L'&') {
          if (wVar9 == L'\t') {
            bVar5 = true;
            if ((uVar8 & 4) != 0) {
              cVar6 = '<';
              lVar13 = 1;
              do {
                sVar12 = utf8_ptr::s_putch(p,(int)cVar6);
                p = p + sVar12;
                cVar6 = "<tab>"[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 6);
              bVar17 = true;
              goto LAB_0028880e;
            }
          }
          else {
            if (wVar9 == L'\n') goto LAB_0028876e;
            if ((wVar9 == L' ') && (bVar5 = true, bVar17 && (uVar8 & 1) != 0)) {
              cVar6 = '&';
              lVar13 = 1;
              do {
                sVar12 = utf8_ptr::s_putch(p,(int)cVar6);
                p = p + sVar12;
                cVar6 = "&nbsp;"[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 7);
              goto LAB_002887ac;
            }
          }
LAB_002887c0:
          bVar17 = bVar5;
          sVar12 = utf8_ptr::s_putch(p,wVar9);
          p = p + sVar12;
        }
        else {
          if (wVar9 < L'>') {
            if (wVar9 == L'&') {
              cVar6 = '&';
              lVar13 = 1;
              do {
                sVar12 = utf8_ptr::s_putch(p,(int)cVar6);
                p = p + sVar12;
                cVar6 = "&amp;"[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 6);
            }
            else {
              if (wVar9 != L'<') goto LAB_002887c0;
              cVar6 = '&';
              lVar13 = 0;
              do {
                sVar12 = utf8_ptr::s_putch(p,(int)cVar6);
                p = p + sVar12;
                cVar6 = "&lt;"[lVar13 + 1];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 4);
            }
          }
          else {
            if (wVar9 == L'\x2028') {
LAB_0028876e:
              bVar5 = true;
              if ((uVar8 & 2) != 0) {
                cVar6 = '<';
                lVar13 = 0;
                do {
                  sVar12 = utf8_ptr::s_putch(p,(int)cVar6);
                  p = p + sVar12;
                  cVar6 = "<br>"[lVar13 + 1];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 4);
LAB_002887ac:
                bVar17 = true;
                goto LAB_0028880e;
              }
              goto LAB_002887c0;
            }
            if (wVar9 != L'>') goto LAB_002887c0;
            cVar6 = '&';
            lVar13 = 0;
            do {
              sVar12 = utf8_ptr::s_putch(p,(int)cVar6);
              p = p + sVar12;
              cVar6 = "&gt;"[lVar13 + 1];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
          }
          bVar17 = false;
        }
LAB_0028880e:
        pbVar14 = pbVar15 + ((long)pbVar14 -
                            (long)(pbVar15 +
                                  (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3
                                         ) + 1));
        pbVar15 = pbVar15 + (ulong)(((*pbVar15 >> 5 & 1) != 0) + 1 & (uint)(*pbVar15 >> 7) * 3) + 1;
      } while (pbVar14 != (byte *)0x0);
    }
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar10;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_htmlify(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *str, uint *in_argc)
{
    size_t bytelen;
    utf8_ptr p;
    utf8_ptr dstp;
    size_t rem;
    size_t extra;
    long flags;
    vm_obj_id_t result_obj;
    int prv_was_sp;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* if they specified flags, pop them */
    if (argc >= 1)
    {
        /* retrieve the flags */
        flags = CVmBif::pop_long_val(vmg0_);
    }
    else
    {
        /* no flags */
        flags = 0;
    }

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* 
     *   scan the string to determine how much space we'll have to add to
     *   generate the htmlified version 
     */
    for (prv_was_sp = FALSE, extra = 0, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        int this_is_sp;

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(p.getch())
        {
        case '&':
            /* we must replace '&' with '&amp;' - this adds four bytes */
            extra += 4;
            break;
            
        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            extra += 3;
            break;

        case '>':
            /* replace '>' with '&gt;' */
            extra += 3;
            break;

        case ' ':
            /* 
             *   If we're in preserve-spaces mode, and the previous space
             *   was some kind of whitespace character, change this to
             *   '&nbsp;' - this adds five bytes 
             */
            if (prv_was_sp && (flags & VMSTR_HTMLIFY_KEEP_SPACES) != 0)
                extra += 5;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\t':
            /* if we're in preserve-tabs mode, change this to '<tab>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) != 0)
                extra += 4;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;

        case '\n':
        case 0x2028:
            /* if we're in preserve-newlines mode, change this to '<br>' */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) != 0)
                extra += 3;

            /* note that this was a whitespace character */
            this_is_sp = TRUE;
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* allocate space for the new string */
    result_obj = create(vmg_ FALSE, bytelen + extra);

    /* get a pointer to the result buffer */
    dstp.set(((CVmObjString *)vm_objp(vmg_ result_obj))->cons_get_buf());

    /* translate the string and write the result */
    for (prv_was_sp = FALSE, p.set((char *)str), rem = bytelen ;
         rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;
        int this_is_sp;

        /* get this character */
        ch = p.getch();

        /* presume it's not a space */
        this_is_sp = FALSE;
        
        /* check what we have */
        switch(ch)
        {
        case '&':
            /* replace '&' with '&amp;' */
            dstp.setch_str("&amp;");
            break;

        case '<':
            /* we must replace '<' with '&lt;' - this adds three bytes */
            dstp.setch_str("&lt;");
            break;

        case '>':
            dstp.setch_str("&gt;");
            break;

        case ' ':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* 
             *   ignore it if not in preserve-spaces mode, or if the
             *   previous character wasn't whitespace of some kind 
             */
            if (!prv_was_sp || (flags & VMSTR_HTMLIFY_KEEP_SPACES) == 0)
                goto do_default;

            /* add the nbsp */
            dstp.setch_str("&nbsp;");
            break;

        case '\t':
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* ignore if not in preserve-tabs mode */
            if ((flags & VMSTR_HTMLIFY_KEEP_TABS) == 0)
                goto do_default;

            /* add the <tab> */
            dstp.setch_str("<tab>");
            break;

        case '\n':
        case 0x2028:
            /* note that this was a whitespace character */
            this_is_sp = TRUE;

            /* if we're not in preserve-newlines mode, ignore it */
            if ((flags & VMSTR_HTMLIFY_KEEP_NEWLINES) == 0)
                goto do_default;

            /* add the <br> */
            dstp.setch_str("<br>");
            break;

        default:
        do_default:
            /* copy this character unchanged */
            dstp.setch(ch);
            break;
        }

        /* for next time, remember whether this is a space */
        prv_was_sp = this_is_sp;
    }

    /* return the new string */
    retval->set_obj(result_obj);
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}